

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  pointer pcVar1;
  cmTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  char *value;
  string msg;
  undefined1 local_d8 [64];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  TVar4 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar4) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames((Names *)local_d8,this->GeneratorTarget,&this->ConfigName)
    ;
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d8._32_8_ != local_d8 + 0x30) {
      operator_delete((void *)local_d8._32_8_,local_d8._48_8_ + 1);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    bVar3 = DetermineIfIntegrityApp(this);
    if (bVar3) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d8,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d8._32_8_ != local_d8 + 0x30) {
      operator_delete((void *)local_d8._32_8_,local_d8._48_8_ + 1);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"add_library(<name> SHARED ...) not supported: ","");
    std::__cxx11::string::_M_append(local_d8,(ulong)(this->Name)._M_dataplus._M_p);
    cmSystemTools::Message((string *)local_d8,(char *)0x0);
    goto LAB_001fef6f;
  case MODULE_LIBRARY:
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"add_library(<name> MODULE ...) not supported: ","");
    std::__cxx11::string::_M_append(local_d8,(ulong)(this->Name)._M_dataplus._M_p);
    cmSystemTools::Message((string *)local_d8,(char *)0x0);
LAB_001fef6f:
    if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
      return;
    }
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d8,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d8._32_8_ != local_d8 + 0x30) {
      operator_delete((void *)local_d8._32_8_,local_d8._48_8_ + 1);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    goto LAB_001ff0c8;
  case GLOBAL_TARGET:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    (*((this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator
      [0x18])();
    iVar5 = std::__cxx11::string::compare((char *)&this->TargetNameReal);
    if (iVar5 != 0) {
      return;
    }
LAB_001ff0c8:
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_001fed15_default;
  }
  pcVar2 = this->GeneratorTarget->Target;
  pcVar1 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"GENERATOR_FILE_NAME","");
  cmTarget::SetProperty(pcVar2,(string *)local_d8,(this->Name)._M_dataplus._M_p);
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  pcVar2 = this->GeneratorTarget->Target;
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"GENERATOR_FILE_NAME_EXT","");
  value = GhsMultiGpj::GetGpjTag(this->TagType);
  cmTarget::SetProperty(pcVar2,(string *)local_d8,value);
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  GenerateTarget(this);
switchD_001fed15_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg = "add_library(<name> SHARED ...) not supported: ";
      msg += this->Name;
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg = "add_library(<name> MODULE ...) not supported: ";
      msg += this->Name;
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  // Tell the global generator the name of the project file
  this->GeneratorTarget->Target->SetProperty("GENERATOR_FILE_NAME",
                                             this->Name.c_str());
  this->GeneratorTarget->Target->SetProperty(
    "GENERATOR_FILE_NAME_EXT", GhsMultiGpj::GetGpjTag(this->TagType));

  this->GenerateTarget();
}